

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_sl_node_t * sl_find_node(ion_skiplist_t *skiplist,ion_key_t key)

{
  ion_key_size_t iVar1;
  bool bVar2;
  char cVar3;
  int local_34;
  sl_node *psStack_30;
  ion_sl_level_t h;
  ion_sl_node_t *cursor;
  int key_size;
  ion_key_t key_local;
  ion_skiplist_t *skiplist_local;
  
  iVar1 = (skiplist->super).record.key_size;
  psStack_30 = skiplist->head;
  local_34 = skiplist->head->height;
  do {
    if (local_34 < 0) {
      return psStack_30;
    }
    while( true ) {
      bVar2 = false;
      if (psStack_30->next[local_34] != (sl_node *)0x0) {
        cVar3 = (*(skiplist->super).compare)(psStack_30->next[local_34]->key,key,iVar1);
        bVar2 = cVar3 < '\x01';
      }
      if (!bVar2) break;
      if ((psStack_30->next[local_34] != (sl_node *)0x0) &&
         (cVar3 = (*(skiplist->super).compare)(psStack_30->next[local_34]->key,key,iVar1),
         cVar3 == '\0')) {
        return psStack_30->next[local_34];
      }
      psStack_30 = psStack_30->next[local_34];
    }
    local_34 = local_34 + -1;
  } while( true );
}

Assistant:

ion_sl_node_t *
sl_find_node(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	int				key_size	= skiplist->super.record.key_size;
	ion_sl_node_t	*cursor		= skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; h--) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) <= 0) {
			if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
				return cursor->next[h];
			}

			cursor = cursor->next[h];
		}
	}

	/* Key was not found, so return closest thing to that key */
	return cursor;
}